

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall
btQuantizedBvh::walkStacklessQuantizedTreeAgainstRay
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,btVector3 *raySource,
          btVector3 *rayTarget,btVector3 *aabbMin,btVector3 *aabbMax,int startNodeIndex,
          int endNodeIndex)

{
  bool bVar1;
  int iVar2;
  btScalar *pbVar3;
  btScalar *in_RDX;
  btVector3 *in_RSI;
  long in_RDI;
  btVector3 *in_R8;
  btVector3 *in_R9;
  btVector3 *pbVar4;
  btVector3 bVar5;
  int in_stack_00000008;
  int in_stack_00000010;
  btVector3 normal;
  btVector3 bounds [2];
  btScalar param;
  unsigned_short quantizedQueryAabbMax [3];
  unsigned_short quantizedQueryAabbMin [3];
  btVector3 rayAabbMax;
  btVector3 rayAabbMin;
  uint sign [3];
  btVector3 rayDirection;
  btScalar lambda_max;
  uint rayBoxOverlap;
  uint boxBoxOverlap;
  bool isLeafNode;
  int escapeIndex;
  btQuantizedBvhNode *rootNode;
  int subTreeSize;
  int walkIterations;
  int curIndex;
  unsigned_short *in_stack_fffffffffffffea8;
  btVector3 *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  btVector3 *in_stack_fffffffffffffec0;
  unsigned_short *in_stack_fffffffffffffec8;
  btQuantizedBvh *in_stack_fffffffffffffed0;
  float fVar6;
  btScalar bVar7;
  float fVar8;
  btScalar bVar9;
  btScalar local_114;
  btScalar *in_stack_fffffffffffffef8;
  btVector3 *in_stack_ffffffffffffff00;
  uint *raySign;
  btVector3 *pbVar10;
  btVector3 *local_d8;
  btScalar abStack_d0 [2];
  uint *local_c8;
  btVector3 *local_c0;
  btVector3 local_b8;
  btVector3 local_a8;
  btVector3 local_98;
  uint local_88;
  uint local_84;
  uint local_80;
  btVector3 local_7c;
  btVector3 local_6c;
  btScalar local_5c;
  uint local_58;
  uint local_54;
  byte local_4d;
  int local_4c;
  btQuantizedBvhNode *local_48;
  int local_3c;
  int local_38;
  int local_34;
  btVector3 *local_30;
  btVector3 *local_28;
  btScalar *local_18;
  btVector3 *local_10;
  
  local_34 = in_stack_00000008;
  local_38 = 0;
  local_3c = in_stack_00000010 - in_stack_00000008;
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_48 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),
                        in_stack_00000008);
  local_54 = 0;
  local_58 = 0;
  local_5c = 1.0;
  bVar5 = operator-(in_stack_fffffffffffffec0,
                    (btVector3 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  local_6c.m_floats._8_8_ = bVar5.m_floats._8_8_;
  local_6c.m_floats._0_8_ = bVar5.m_floats._0_8_;
  btVector3::normalize(in_stack_fffffffffffffeb0);
  bVar5 = operator-(in_stack_fffffffffffffec0,
                    (btVector3 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  local_7c.m_floats._8_8_ = bVar5.m_floats._8_8_;
  local_7c.m_floats._0_8_ = bVar5.m_floats._0_8_;
  local_5c = btVector3::dot(&local_6c,&local_7c);
  pbVar3 = btVector3::operator_cast_to_float_(&local_6c);
  if ((*pbVar3 != 0.0) || (NAN(*pbVar3))) {
    pbVar3 = btVector3::operator_cast_to_float_(&local_6c);
    local_114 = 1.0 / *pbVar3;
  }
  else {
    local_114 = 1e+18;
  }
  pbVar3 = btVector3::operator_cast_to_float_(&local_6c);
  *pbVar3 = local_114;
  pbVar3 = btVector3::operator_cast_to_float_(&local_6c);
  if ((pbVar3[1] != 0.0) || (NAN(pbVar3[1]))) {
    pbVar3 = btVector3::operator_cast_to_float_(&local_6c);
    fVar8 = 1.0 / pbVar3[1];
  }
  else {
    fVar8 = 1e+18;
  }
  bVar9 = fVar8;
  pbVar3 = btVector3::operator_cast_to_float_(&local_6c);
  pbVar3[1] = fVar8;
  pbVar3 = btVector3::operator_cast_to_float_(&local_6c);
  if ((pbVar3[2] != 0.0) || (NAN(pbVar3[2]))) {
    pbVar3 = btVector3::operator_cast_to_float_(&local_6c);
    fVar6 = 1.0 / pbVar3[2];
  }
  else {
    fVar6 = 1e+18;
  }
  bVar7 = fVar6;
  pbVar3 = btVector3::operator_cast_to_float_(&local_6c);
  pbVar3[2] = fVar6;
  pbVar3 = btVector3::operator_cast_to_float_(&local_6c);
  local_88 = (uint)(*pbVar3 < 0.0);
  pbVar3 = btVector3::operator_cast_to_float_(&local_6c);
  local_84 = (uint)(pbVar3[1] < 0.0);
  pbVar3 = btVector3::operator_cast_to_float_(&local_6c);
  local_80 = (uint)(pbVar3[2] < 0.0);
  local_98.m_floats._0_8_ = *(undefined8 *)local_18;
  local_98.m_floats._8_8_ = *(undefined8 *)(local_18 + 2);
  local_a8.m_floats._0_8_ = *(undefined8 *)local_18;
  local_a8.m_floats._8_8_ = *(undefined8 *)(local_18 + 2);
  btVector3::setMin(in_stack_fffffffffffffec0,
                    (btVector3 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  btVector3::setMax(in_stack_fffffffffffffec0,
                    (btVector3 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  btVector3::operator+=(&local_98,local_28);
  btVector3::operator+=(&local_a8,local_30);
  quantizeWithClamp(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                    in_stack_fffffffffffffebc);
  quantizeWithClamp(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                    in_stack_fffffffffffffebc);
  while (local_34 < in_stack_00000010) {
    local_38 = local_38 + 1;
    local_b8.m_floats[0] = 1.0;
    local_58 = 0;
    local_54 = testQuantizedAabbAgainstQuantizedAabb
                         ((unsigned_short *)in_stack_fffffffffffffec0,
                          (unsigned_short *)
                          CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                          (unsigned_short *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_4d = btQuantizedBvhNode::isLeafNode(local_48);
    if (local_54 != 0) {
      pbVar4 = &local_b8;
      pbVar10 = (btVector3 *)&local_d8;
      do {
        in_stack_fffffffffffffec0 = pbVar10;
        btVector3::btVector3(in_stack_fffffffffffffec0);
        pbVar10 = in_stack_fffffffffffffec0 + 1;
      } while (in_stack_fffffffffffffec0 + 1 != pbVar4);
      bVar5 = unQuantize((btQuantizedBvh *)CONCAT44(bVar9,fVar8),
                         (unsigned_short *)CONCAT44(bVar7,fVar6));
      abStack_d0 = bVar5.m_floats._8_8_;
      pbVar10 = bVar5.m_floats._0_8_;
      local_d8 = pbVar10;
      bVar5 = unQuantize((btQuantizedBvh *)CONCAT44(bVar9,fVar8),
                         (unsigned_short *)CONCAT44(bVar7,fVar6));
      pbVar4 = bVar5.m_floats._8_8_;
      raySign = bVar5.m_floats._0_8_;
      local_c8 = raySign;
      local_c0 = pbVar4;
      btVector3::operator-=((btVector3 *)&local_d8,local_30);
      btVector3::operator-=((btVector3 *)&local_c8,local_28);
      btVector3::btVector3((btVector3 *)&stack0xfffffffffffffef8);
      bVar1 = btRayAabb2(pbVar10,pbVar4,raySign,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                         (btScalar)((ulong)in_RDI >> 0x20),(btScalar)in_RDI);
      local_58 = (uint)bVar1;
    }
    if (((local_4d & 1) != 0) && (local_58 != 0)) {
      in_stack_fffffffffffffeb0 = local_10;
      in_stack_fffffffffffffebc = btQuantizedBvhNode::getPartId(local_48);
      iVar2 = btQuantizedBvhNode::getTriangleIndex(local_48);
      (**(code **)(*(long *)in_stack_fffffffffffffeb0->m_floats + 0x10))
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffebc,iVar2);
    }
    if ((local_58 == 0) && ((local_4d & 1) == 0)) {
      local_4c = btQuantizedBvhNode::getEscapeIndex(local_48);
      local_48 = local_48 + local_4c;
      local_34 = local_4c + local_34;
    }
    else {
      local_48 = local_48 + 1;
      local_34 = local_34 + 1;
    }
  }
  if (maxIterations < local_38) {
    maxIterations = local_38;
  }
  return;
}

Assistant:

void	btQuantizedBvh::walkStacklessQuantizedTreeAgainstRay(btNodeOverlapCallback* nodeCallback, const btVector3& raySource, const btVector3& rayTarget, const btVector3& aabbMin, const btVector3& aabbMax, int startNodeIndex,int endNodeIndex) const
{
	btAssert(m_useQuantization);
	
	int curIndex = startNodeIndex;
	int walkIterations = 0;
	int subTreeSize = endNodeIndex - startNodeIndex;
	(void)subTreeSize;

	const btQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[startNodeIndex];
	int escapeIndex;
	
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned boxBoxOverlap = 0;
	unsigned rayBoxOverlap = 0;

	btScalar lambda_max = 1.0;

#ifdef RAYAABB2
	btVector3 rayDirection = (rayTarget-raySource);
	rayDirection.normalize ();
	lambda_max = rayDirection.dot(rayTarget-raySource);
	///what about division by zero? --> just set rayDirection[i] to 1.0
	rayDirection[0] = rayDirection[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDirection[0];
	rayDirection[1] = rayDirection[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDirection[1];
	rayDirection[2] = rayDirection[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDirection[2];
	unsigned int sign[3] = { rayDirection[0] < 0.0, rayDirection[1] < 0.0, rayDirection[2] < 0.0};
#endif

	/* Quick pruning by quantized box */
	btVector3 rayAabbMin = raySource;
	btVector3 rayAabbMax = raySource;
	rayAabbMin.setMin(rayTarget);
	rayAabbMax.setMax(rayTarget);

	/* Add box cast extents to bounding box */
	rayAabbMin += aabbMin;
	rayAabbMax += aabbMax;

	unsigned short int quantizedQueryAabbMin[3];
	unsigned short int quantizedQueryAabbMax[3];
	quantizeWithClamp(quantizedQueryAabbMin,rayAabbMin,0);
	quantizeWithClamp(quantizedQueryAabbMax,rayAabbMax,1);

	while (curIndex < endNodeIndex)
	{

//#define VISUALLY_ANALYZE_BVH 1
#ifdef VISUALLY_ANALYZE_BVH
		//some code snippet to debugDraw aabb, to visually analyze bvh structure
		static int drawPatch = 0;
		//need some global access to a debugDrawer
		extern btIDebugDraw* debugDrawerPtr;
		if (curIndex==drawPatch)
		{
			btVector3 aabbMin,aabbMax;
			aabbMin = unQuantize(rootNode->m_quantizedAabbMin);
			aabbMax = unQuantize(rootNode->m_quantizedAabbMax);
			btVector3	color(1,0,0);
			debugDrawerPtr->drawAabb(aabbMin,aabbMax,color);
		}
#endif//VISUALLY_ANALYZE_BVH

		//catch bugs in tree data
		btAssert (walkIterations < subTreeSize);

		walkIterations++;
		//PCK: unsigned instead of bool
		// only interested if this is closer than any previous hit
		btScalar param = 1.0;
		rayBoxOverlap = 0;
		boxBoxOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin,quantizedQueryAabbMax,rootNode->m_quantizedAabbMin,rootNode->m_quantizedAabbMax);
		isLeafNode = rootNode->isLeafNode();
		if (boxBoxOverlap)
		{
			btVector3 bounds[2];
			bounds[0] = unQuantize(rootNode->m_quantizedAabbMin);
			bounds[1] = unQuantize(rootNode->m_quantizedAabbMax);
			/* Add box cast extents */
			bounds[0] -= aabbMax;
			bounds[1] -= aabbMin;
			btVector3 normal;
#if 0
			bool ra2 = btRayAabb2 (raySource, rayDirection, sign, bounds, param, 0.0, lambda_max);
			bool ra = btRayAabb (raySource, rayTarget, bounds[0], bounds[1], param, normal);
			if (ra2 != ra)
			{
				printf("functions don't match\n");
			}
#endif
#ifdef RAYAABB2
			///careful with this check: need to check division by zero (above) and fix the unQuantize method
			///thanks Joerg/hiker for the reproduction case!
			///http://www.bulletphysics.com/Bullet/phpBB3/viewtopic.php?f=9&t=1858

			//BT_PROFILE("btRayAabb2");
			rayBoxOverlap = btRayAabb2 (raySource, rayDirection, sign, bounds, param, 0.0f, lambda_max);
			
#else
			rayBoxOverlap = true;//btRayAabb(raySource, rayTarget, bounds[0], bounds[1], param, normal);
#endif
		}
		
		if (isLeafNode && rayBoxOverlap)
		{
			nodeCallback->processNode(rootNode->getPartId(),rootNode->getTriangleIndex());
		}
		
		//PCK: unsigned instead of bool
		if ((rayBoxOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		} else
		{
			escapeIndex = rootNode->getEscapeIndex();
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;

}